

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.c
# Opt level: O3

DeferredSocketOpener *
local_proxy_opener(SockAddr *addr,int port,Plug *plug,Conf *conf,Interactor *itr)

{
  undefined8 *puVar1;
  SockAddr *pSVar2;
  Conf *pCVar3;
  LogPolicy *pLVar4;
  Seat *pSVar5;
  
  puVar1 = (undefined8 *)safemalloc(1,0x80,0);
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xe] = 0;
  puVar1[3] = plug;
  puVar1[0xf] = &LocalProxyOpener_openervt;
  puVar1[0xc] = &LocalProxyOpener_interactorvt;
  pSVar2 = sk_addr_dup(addr);
  puVar1[4] = pSVar2;
  *(int *)(puVar1 + 5) = port;
  pCVar3 = conf_copy(conf);
  puVar1[6] = pCVar3;
  if (itr != (Interactor *)0x0) {
    puVar1[7] = itr;
    puVar1[0xd] = itr;
    pLVar4 = (*itr->vt->logpolicy)(itr);
    puVar1[8] = pLVar4;
    pSVar5 = interactor_borrow_seat((Interactor *)puVar1[7]);
    puVar1[9] = pSVar5;
  }
  return (DeferredSocketOpener *)(puVar1 + 0xf);
}

Assistant:

DeferredSocketOpener *local_proxy_opener(
    SockAddr *addr, int port, Plug *plug, Conf *conf, Interactor *itr)
{
    LocalProxyOpener *lp = snew(LocalProxyOpener);
    memset(lp, 0, sizeof(*lp));
    lp->plug = plug;
    lp->opener.vt = &LocalProxyOpener_openervt;
    lp->interactor.vt = &LocalProxyOpener_interactorvt;
    lp->addr = sk_addr_dup(addr);
    lp->port = port;
    lp->conf = conf_copy(conf);

    if (itr) {
        lp->clientitr = itr;
        interactor_set_child(lp->clientitr, &lp->interactor);
        lp->clientlp = interactor_logpolicy(lp->clientitr);
        lp->clientseat = interactor_borrow_seat(lp->clientitr);
    }

    return &lp->opener;
}